

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_point_query_base.h
# Opt level: O1

void __thiscall
S2ClosestPointQueryBase<S2MinDistance,_int>::MaybeAddResult
          (S2ClosestPointQueryBase<S2MinDistance,_int> *this,PointData *point_data)

{
  _Head_base<0UL,_Vector3<double>,_false> *p_Var1;
  pointer *ppRVar2;
  priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  *this_00;
  double dVar3;
  S2Region *pSVar4;
  Options *pOVar5;
  iterator __position;
  S1ChordAngle SVar6;
  S1ChordAngle b;
  int iVar7;
  const_reference pRVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Result result;
  S2MinDistance distance;
  value_type local_30;
  S1ChordAngle local_20;
  
  local_20.length2_ = (this->distance_limit_).super_S1ChordAngle.length2_;
  p_Var1 = &(point_data->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
            super__Head_base<0UL,_Vector3<double>,_false>;
  iVar7 = (*this->target_->_vptr_S2DistanceTarget[3])(this->target_,p_Var1);
  if ((char)iVar7 != '\0') {
    pSVar4 = this->options_->region_;
    if ((pSVar4 != (S2Region *)0x0) &&
       (iVar7 = (*pSVar4->_vptr_S2Region[8])(pSVar4,p_Var1), (char)iVar7 == '\0')) {
      return;
    }
    uVar9 = SUB84(local_20.length2_,0);
    uVar10 = (undefined4)((ulong)local_20.length2_ >> 0x20);
    local_30.distance_.super_S1ChordAngle.length2_ = (S1ChordAngle)(S1ChordAngle)local_20.length2_;
    pOVar5 = this->options_;
    iVar7 = pOVar5->max_results_;
    local_30.point_data_ = point_data;
    if ((long)iVar7 == 0x7fffffff) {
      __position._M_current =
           (this->result_vector_).
           super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->result_vector_).
          super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<S2ClosestPointQueryBase<S2MinDistance,int>::Result,std::allocator<S2ClosestPointQueryBase<S2MinDistance,int>::Result>>
        ::_M_realloc_insert<S2ClosestPointQueryBase<S2MinDistance,int>::Result_const&>
                  ((vector<S2ClosestPointQueryBase<S2MinDistance,int>::Result,std::allocator<S2ClosestPointQueryBase<S2MinDistance,int>::Result>>
                    *)&this->result_vector_,__position,&local_30);
      }
      else {
        ((__position._M_current)->distance_).super_S1ChordAngle.length2_ = local_20.length2_;
        (__position._M_current)->point_data_ = point_data;
        ppRVar2 = &(this->result_vector_).
                   super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppRVar2 = *ppRVar2 + 1;
      }
    }
    else {
      if (iVar7 == 1) {
        (this->result_singleton_).distance_.super_S1ChordAngle.length2_ = local_20.length2_;
        (this->result_singleton_).point_data_ = point_data;
        dVar3 = (pOVar5->max_error_).length2_;
        uVar11 = SUB84(dVar3,0);
        uVar12 = (undefined4)((ulong)dVar3 >> 0x20);
      }
      else {
        this_00 = &this->result_set_;
        if ((ulong)(long)iVar7 <= (this->result_set_).c.allocator_and_tag_.tag_.size_ >> 1) {
          std::
          priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
          ::pop(this_00);
        }
        std::
        priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
        ::push(this_00,&local_30);
        if ((this->result_set_).c.allocator_and_tag_.tag_.size_ >> 1 <
            (ulong)(long)this->options_->max_results_) {
          return;
        }
        pRVar8 = absl::
                 InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                 ::front(&this_00->c);
        dVar3 = (pRVar8->distance_).super_S1ChordAngle.length2_;
        uVar9 = SUB84(dVar3,0);
        uVar10 = (undefined4)((ulong)dVar3 >> 0x20);
        dVar3 = (this->options_->max_error_).length2_;
        uVar11 = SUB84(dVar3,0);
        uVar12 = (undefined4)((ulong)dVar3 >> 0x20);
      }
      SVar6.length2_._4_4_ = uVar10;
      SVar6.length2_._0_4_ = uVar9;
      b.length2_._4_4_ = uVar12;
      b.length2_._0_4_ = uVar11;
      SVar6 = operator-(SVar6,b);
      (this->distance_limit_).super_S1ChordAngle.length2_ = SVar6.length2_;
    }
  }
  return;
}

Assistant:

void S2ClosestPointQueryBase<Distance, Data>::MaybeAddResult(
    const PointData* point_data) {
  Distance distance = distance_limit_;
  if (!target_->UpdateMinDistance(point_data->point(), &distance)) return;

  const S2Region* region = options().region();
  if (region && !region->Contains(point_data->point())) return;

  Result result(distance, point_data);
  if (options().max_results() == 1) {
    // Optimization for the common case where only the closest point is wanted.
    result_singleton_ = result;
    distance_limit_ = result.distance() - options().max_error();
  } else if (options().max_results() == Options::kMaxMaxResults) {
    result_vector_.push_back(result);  // Sort/unique at end.
  } else {
    // Add this point to result_set_.  Note that with the current algorithm
    // each candidate point is considered at most once (except for one special
    // case where max_results() == 1, see InitQueue for details), so we don't
    // need to worry about possibly adding a duplicate entry here.
    if (result_set_.size() >= options().max_results()) {
      result_set_.pop();  // Replace the furthest result point.
    }
    result_set_.push(result);
    if (result_set_.size() >= options().max_results()) {
      distance_limit_ = result_set_.top().distance() - options().max_error();
    }
  }
}